

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O2

void apx_socketServer_start_unix_server(apx_socketServer_t *self,char *file_path,char *tag)

{
  msocket_server_t *pmVar1;
  char *pcVar2;
  code *local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  
  if (file_path != (char *)0x0 && self != (apx_socketServer_t *)0x0) {
    pcVar2 = strdup(file_path);
    self->unix_server_file = pcVar2;
    if (tag != (char *)0x0) {
      pcVar2 = strdup(tag);
      self->unix_connection_tag = pcVar2;
    }
    local_30 = 0;
    uStack_28 = 0;
    local_20 = 0;
    local_40 = 0;
    uStack_38 = 0;
    local_48 = apx_socketServer_unix_accept;
    pmVar1 = &self->unix_server;
    msocket_server_create(pmVar1,1,0);
    msocket_server_disable_cleanup(pmVar1);
    msocket_server_set_handler(pmVar1,&local_48,self);
    msocket_server_unix_start(pmVar1,self->unix_server_file);
    self->is_unix_server_started = true;
    printf("Listening on UNIX socket %s\n",self->unix_server_file);
  }
  return;
}

Assistant:

void apx_socketServer_start_unix_server(apx_socketServer_t *self, const char *file_path, const char *tag)
{
   if ( (self != 0) && (file_path != 0))
   {
      //char msg[APX_MAX_LOG_LEN];
      msocket_handler_t server_handler;
      self->unix_server_file = STRDUP(file_path);
      if (tag != 0)
      {
         self->unix_connection_tag = STRDUP(tag);
      }
      memset(&server_handler,0,sizeof(server_handler));
#ifndef UNIT_TEST
      server_handler.tcp_accept = apx_socketServer_unix_accept;
#endif
      msocket_server_create(&self->unix_server, AF_LOCAL, NULL);
      msocket_server_disable_cleanup(&self->unix_server); //we will use our own garbage collector
      msocket_server_sethandler(&self->unix_server, &server_handler, self);
      msocket_server_unix_start(&self->unix_server, self->unix_server_file);
      self->is_unix_server_started = true;
      printf("Listening on UNIX socket %s\n", self->unix_server_file);
//      sprintf(msg, "Listening on UNIX socket %s", self->unixServerFile);
//      apx_server_logEvent(self->parent, APX_LOG_LEVEL_INFO, APX_SOCKET_SERVER_LABEL, &msg[0]);
   }
}